

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O0

char32_t jsonnet::internal::decode_utf8(string *str,size_t *i)

{
  char cVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  long *in_RSI;
  ulong in_RDI;
  char c3;
  char c2_1;
  char c1_2;
  char c2;
  char c1_1;
  char c1;
  char c0;
  undefined4 local_4;
  
  pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
  cVar1 = *pcVar5;
  if (((int)cVar1 & 0x80U) == 0) {
    local_4 = (char32_t)cVar1;
  }
  else if (((int)cVar1 & 0xe0U) == 0xc0) {
    lVar4 = *in_RSI;
    uVar6 = std::__cxx11::string::length();
    if (lVar4 + 1U < uVar6) {
      *in_RSI = *in_RSI + 1;
      pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
      if (((int)*pcVar5 & 0xc0U) == 0x80) {
        local_4 = ((int)cVar1 & 0x1fU) << 6 | (int)*pcVar5 & 0x3fU;
      }
      else {
        local_4 = L'�';
      }
    }
    else {
      local_4 = L'�';
    }
  }
  else if (((int)cVar1 & 0xf0U) == 0xe0) {
    lVar4 = *in_RSI;
    uVar6 = std::__cxx11::string::length();
    if (lVar4 + 2U < uVar6) {
      *in_RSI = *in_RSI + 1;
      pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
      cVar2 = *pcVar5;
      if (((int)cVar2 & 0xc0U) == 0x80) {
        *in_RSI = *in_RSI + 1;
        pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
        if (((int)*pcVar5 & 0xc0U) == 0x80) {
          local_4 = ((int)cVar1 & 0xfU) << 0xc | ((int)cVar2 & 0x3fU) << 6 | (int)*pcVar5 & 0x3fU;
        }
        else {
          local_4 = L'�';
        }
      }
      else {
        local_4 = L'�';
      }
    }
    else {
      local_4 = L'�';
    }
  }
  else if (((int)cVar1 & 0xf8U) == 0xf0) {
    lVar4 = *in_RSI;
    uVar6 = std::__cxx11::string::length();
    if (lVar4 + 3U < uVar6) {
      *in_RSI = *in_RSI + 1;
      pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
      cVar2 = *pcVar5;
      if (((int)cVar2 & 0xc0U) == 0x80) {
        *in_RSI = *in_RSI + 1;
        pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
        cVar3 = *pcVar5;
        if (((int)cVar3 & 0xc0U) == 0x80) {
          *in_RSI = *in_RSI + 1;
          pcVar5 = (char *)std::__cxx11::string::operator[](in_RDI);
          if (((int)*pcVar5 & 0xc0U) == 0x80) {
            local_4 = ((int)cVar1 & 7U) << 0x12 | ((int)cVar2 & 0x3fU) << 0xc |
                      ((int)cVar3 & 0x3fU) << 6 | (int)*pcVar5 & 0x3fU;
          }
          else {
            local_4 = L'�';
          }
        }
        else {
          local_4 = L'�';
        }
      }
      else {
        local_4 = L'�';
      }
    }
    else {
      local_4 = L'�';
    }
  }
  else {
    local_4 = L'�';
  }
  return local_4;
}

Assistant:

static inline char32_t decode_utf8(const std::string &str, size_t &i)
{
    char c0 = str[i];
    if ((c0 & 0x80) == 0) {  // 0xxxxxxx
        return c0;
    } else if ((c0 & 0xE0) == 0xC0) {  // 110yyyxx 10xxxxxx
        if (i + 1 >= str.length()) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c1 = str[++i];
        if ((c1 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        return ((c0 & 0x1F) << 6ul) | (c1 & 0x3F);
    } else if ((c0 & 0xF0) == 0xE0) {  // 1110yyyy 10yyyyxx 10xxxxxx
        if (i + 2 >= str.length()) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c1 = str[++i];
        if ((c1 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c2 = str[++i];
        if ((c2 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        return ((c0 & 0xF) << 12ul) | ((c1 & 0x3F) << 6) | (c2 & 0x3F);
    } else if ((c0 & 0xF8) == 0xF0) {  // 11110zzz 10zzyyyy 10yyyyxx 10xxxxxx
        if (i + 3 >= str.length()) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c1 = str[++i];
        if ((c1 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c2 = str[++i];
        if ((c2 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c3 = str[++i];
        if ((c3 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        return ((c0 & 0x7) << 18ul) | ((c1 & 0x3F) << 12ul) | ((c2 & 0x3F) << 6) | (c3 & 0x3F);
    } else {
        return JSONNET_CODEPOINT_ERROR;
    }
}